

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O1

vector<double,_std::allocator<double>_> *
polyscope::gather<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *input,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *perm)

{
  pointer puVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  allocator_type local_19;
  
  lVar4 = (long)(perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,input);
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,lVar4 >> 2,&local_19);
    puVar1 = (perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(perm->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 2;
      pdVar2 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        pdVar3[lVar5] = pdVar2[puVar1[lVar5]];
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const std::vector<T>& input, const std::vector<uint32_t>& perm) {
  // TODO figure out if there's a copy to be avoided here
  if (perm.size() == 0) {
    return input;
  }
  std::vector<T> result(perm.size());
  for (size_t i = 0; i < perm.size(); i++) {
    result[i] = input[perm[i]];
  }
  return result;
}